

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbezier.cpp
# Opt level: O3

VPointF __thiscall VBezier::derivative(VBezier *this,float t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  VPointF VVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar11 = t * t;
  fVar12 = -(1.0 - t) * (1.0 - t);
  fVar13 = fVar11 * 3.0 + t * -4.0 + 1.0;
  fVar10 = t + t + fVar11 * -3.0;
  uVar1 = this->x1;
  uVar5 = this->y1;
  uVar2 = this->x2;
  uVar6 = this->y2;
  uVar3 = this->x3;
  uVar7 = this->y3;
  uVar4 = this->x4;
  uVar8 = this->y4;
  VVar9.my = (fVar10 * (float)uVar7 + fVar12 * (float)uVar5 + (float)uVar6 * fVar13 +
             fVar11 * (float)uVar8) * 3.0;
  VVar9.mx = (fVar10 * (float)uVar3 + fVar12 * (float)uVar1 + (float)uVar2 * fVar13 +
             fVar11 * (float)uVar4) * 3.0;
  return VVar9;
}

Assistant:

VPointF VBezier::derivative(float t) const
{
    // p'(t) = 3 * (-(1-2t+t^2) * p0 + (1 - 4 * t + 3 * t^2) * p1 + (2 * t - 3 *
    // t^2) * p2 + t^2 * p3)

    float m_t = 1.0f - t;

    float d = t * t;
    float a = -m_t * m_t;
    float b = 1 - 4 * t + 3 * d;
    float c = 2 * t - 3 * d;

    return 3 * VPointF(a * x1 + b * x2 + c * x3 + d * x4,
                       a * y1 + b * y2 + c * y3 + d * y4);
}